

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextVkImpl::SetPipelineState
          (DeviceContextVkImpl *this,IPipelineState *pPipelineState)

{
  VulkanCommandBuffer *this_00;
  PipelineStateVkImpl *this_01;
  VkPipeline RayTracingPipeline;
  PipelineStateVkImpl *this_02;
  RefCntAutoPtr<Diligent::PipelineStateVkImpl> RVar1;
  bool bVar2;
  Uint32 UVar3;
  Uint32 UVar4;
  GraphicsPipelineDesc *pGVar5;
  ResourceBindInfo *Resources;
  ulong uVar6;
  PipelineResourceSignatureImplType *pPVar7;
  uint uVar8;
  byte bVar9;
  uint uVar10;
  Uint32 *pUVar11;
  bool bVar12;
  RefCntAutoPtr<Diligent::PipelineStateVkImpl> pOldPipeline;
  Uint32 DvpCompatibleSRBCount;
  string msg;
  RefCntAutoPtr<Diligent::PipelineStateVkImpl> local_78;
  RefCntAutoPtr<Diligent::PipelineStateVkImpl> *local_70;
  PipelineLayoutVk *local_68;
  Uint32 local_5c;
  string local_58;
  DeviceContextVkImpl *local_38;
  DescriptorSetInfo *Args_1;
  
  local_70 = &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
              super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState;
  RefCntAutoPtr<Diligent::PipelineStateVkImpl>::RefCntAutoPtr(&local_78,local_70);
  bVar2 = DeviceContextBase<Diligent::EngineVkImplTraits>::SetPipelineState
                    ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pPipelineState,
                     (INTERFACE_ID *)PipelineStateVkImpl::IID_InternalImpl);
  RVar1.m_pObject = local_78.m_pObject;
  if (!bVar2) goto LAB_001b58bd;
  if (local_78.m_pObject == (PipelineStateVkImpl *)0x0) {
    bVar2 = true;
    bVar9 = 0;
  }
  else {
    PipelineStateBase<Diligent::EngineVkImplTraits>::CheckPipelineReady
              (&(local_78.m_pObject)->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
    bVar12 = (((RVar1.m_pObject)->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
              .m_Desc.PipelineType & ~PIPELINE_TYPE_MESH) == PIPELINE_TYPE_GRAPHICS;
    bVar2 = !bVar12;
    if (bVar12) {
      pGVar5 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetGraphicsPipelineDesc
                         (&(local_78.m_pObject)->
                           super_PipelineStateBase<Diligent::EngineVkImplTraits>);
      bVar9 = (pGVar5->RasterizerDesc).ScissorEnable ^ 1;
    }
    else {
      bVar9 = 0;
    }
    RefCntAutoPtr<Diligent::PipelineStateVkImpl>::Release(&local_78);
  }
  EnsureVkCmdBuffer(this);
  this_01 = local_70->m_pObject;
  RayTracingPipeline = (this_01->m_Pipeline).m_VkObject;
  PipelineStateBase<Diligent::EngineVkImplTraits>::CheckPipelineReady
            (&this_01->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
  switch((this_01->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
         super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
         .m_Desc.PipelineType) {
  case PIPELINE_TYPE_GRAPHICS:
  case PIPELINE_TYPE_MESH:
    local_68 = (PipelineLayoutVk *)CONCAT71(local_68._1_7_,bVar2);
    pGVar5 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetGraphicsPipelineDesc
                       (&local_70->m_pObject->super_PipelineStateBase<Diligent::EngineVkImplTraits>)
    ;
    this_00 = &this->m_CommandBuffer;
    VulkanUtilities::VulkanCommandBuffer::BindGraphicsPipeline(this_00,RayTracingPipeline);
    if ((char)local_68 != '\0') {
      VulkanUtilities::VulkanCommandBuffer::SetStencilReference
                (this_00,(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_StencilRef);
      VulkanUtilities::VulkanCommandBuffer::SetBlendConstants
                (this_00,(float *)(this->
                                  super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                                  super_DeviceContextBase<Diligent::EngineVkImplTraits>.
                                  m_BlendFactors);
      bVar9 = 1;
      CommitViewports(this);
    }
    if (((pGVar5->RasterizerDesc).ScissorEnable == true) && (bVar9 != 0)) {
      CommitScissorRects(this);
    }
    (this->m_State).vkPipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
    (this->m_State).NullRenderTargets =
         pGVar5->DSVFormat == TEX_FORMAT_UNKNOWN &&
         (pGVar5->NumRenderTargets == '\0' && pGVar5->pRenderPass == (IRenderPass *)0x0);
    break;
  case PIPELINE_TYPE_COMPUTE:
    VulkanUtilities::VulkanCommandBuffer::BindComputePipeline
              (&this->m_CommandBuffer,RayTracingPipeline);
    (this->m_State).vkPipelineBindPoint = VK_PIPELINE_BIND_POINT_COMPUTE;
    break;
  case PIPELINE_TYPE_RAY_TRACING:
    VulkanUtilities::VulkanCommandBuffer::BindRayTracingPipeline
              (&this->m_CommandBuffer,RayTracingPipeline);
    (this->m_State).vkPipelineBindPoint = VK_PIPELINE_BIND_POINT_RAY_TRACING_KHR;
    break;
  case PIPELINE_TYPE_LAST:
    FormatString<char[26]>(&local_58,(char (*) [26])"Unsupported pipeline type");
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"SetPipelineState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x15e);
    goto LAB_001b5746;
  default:
    FormatString<char[22]>(&local_58,(char (*) [22])"unknown pipeline type");
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"SetPipelineState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x161);
LAB_001b5746:
    std::__cxx11::string::~string((string *)&local_58);
  }
  this_02 = local_70->m_pObject;
  UVar3 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetResourceSignatureCount
                    (&this_02->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
  Resources = GetBindInfo(this,(this_01->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                               super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                               .m_Desc.PipelineType);
  local_5c = 0;
  DeviceContextBase<Diligent::EngineVkImplTraits>::PrepareCommittedResources
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,
             &Resources->super_CommittedShaderResources,&local_5c);
  local_68 = &this_02->m_PipelineLayout;
  uVar6 = (ulong)local_5c;
  Args_1 = (Resources->SetInfo)._M_elems + uVar6;
  for (; uVar6 < UVar3; uVar6 = uVar6 + 1) {
    (Args_1->vkSets)._M_elems[0] = (VkDescriptorSet_T *)0x0;
    (Args_1->vkSets)._M_elems[1] = (VkDescriptorSet_T *)0x0;
    Args_1 = Args_1 + 1;
  }
  Resources->vkPipelineLayout = (this_02->m_PipelineLayout).m_VkPipelineLayout.m_VkObject;
  pUVar11 = &(Resources->SetInfo)._M_elems[0].LastBoundBaseInd;
  uVar10 = 0;
  local_38 = this;
  for (uVar6 = 0; UVar3 != uVar6; uVar6 = uVar6 + 1) {
    pPVar7 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetResourceSignature
                       (&local_70->m_pObject->super_PipelineStateBase<Diligent::EngineVkImplTraits>,
                        (uint)uVar6);
    if ((pPVar7 == (PipelineResourceSignatureImplType *)0x0) ||
       ((pPVar7->m_VkDescrSetLayouts)._M_elems[0].m_VkObject == (VkDescriptorSetLayout_T *)0x0 &&
        (pPVar7->m_VkDescrSetLayouts)._M_elems[1].m_VkObject == (VkDescriptorSetLayout_T *)0x0)) {
      *(undefined8 *)(pUVar11 + -2) = 0;
      (((DescriptorSetInfo *)(pUVar11 + -6))->vkSets)._M_elems[0] = (VkDescriptorSet_T *)0x0;
      *(VkDescriptorSet_T **)(pUVar11 + -4) = (VkDescriptorSet_T *)0x0;
      *pUVar11 = 0xffffffff;
    }
    else {
      if (((Resources->super_CommittedShaderResources).ActiveSRBMask >> ((uint)uVar6 & 0x1f) & 1) ==
          0) {
        FormatString<char[26],char[35]>
                  (&local_58,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"BindInfo.ActiveSRBMask & (1u << i)",(char (*) [35])Args_1);
        DebugAssertionFailed
                  (local_58._M_dataplus._M_p,"SetPipelineState",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x180);
        std::__cxx11::string::~string((string *)&local_58);
      }
      UVar4 = PipelineLayoutVk::GetFirstDescrSetIndex
                        (local_68,(uint)(pPVar7->
                                        super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>
                                        ).
                                        super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                                        .m_Desc.BindingIndex);
      pUVar11[-2] = UVar4;
      uVar8 = (uint)pPVar7->m_DynamicStorageBufferCount + (uint)pPVar7->m_DynamicUniformBufferCount;
      Args_1 = (DescriptorSetInfo *)(ulong)uVar8;
      pUVar11[-1] = uVar8;
      uVar10 = uVar10 + uVar8;
    }
    pUVar11 = pUVar11 + 8;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&local_38->m_DynamicBufferOffsets,(ulong)uVar10);
LAB_001b58bd:
  RefCntAutoPtr<Diligent::PipelineStateVkImpl>::Release(&local_78);
  return;
}

Assistant:

void DeviceContextVkImpl::SetPipelineState(IPipelineState* pPipelineState)
{
    RefCntAutoPtr<PipelineStateVkImpl> pOldPipeline = m_pPipelineState;
    if (!TDeviceContextBase::SetPipelineState(pPipelineState, PipelineStateVkImpl::IID_InternalImpl))
        return;

    bool CommitStates  = false;
    bool CommitScissor = false;
    if (!pOldPipeline)
    {
        // If no pipeline state is bound, we are working with the fresh command
        // list. We have to commit the states set in the context that are not
        // committed by the draw command (render targets, viewports, scissor rects, etc.)
        CommitStates = true;
    }
    else
    {
        const PipelineStateDesc& OldPSODesc = pOldPipeline->GetDesc();
        // Commit all graphics states when switching from non-graphics pipeline
        // This is necessary because if the command list had been flushed
        // and the first PSO set on the command list was a compute pipeline,
        // the states would otherwise never be committed (since m_pPipelineState != nullptr)
        CommitStates = !OldPSODesc.IsAnyGraphicsPipeline();
        // We also need to update scissor rect if ScissorEnable state was disabled in previous pipeline
        if (OldPSODesc.IsAnyGraphicsPipeline())
            CommitScissor = !pOldPipeline->GetGraphicsPipelineDesc().RasterizerDesc.ScissorEnable;
        pOldPipeline.Release();
    }

    EnsureVkCmdBuffer();

    const VkPipeline         vkPipeline = m_pPipelineState->GetVkPipeline();
    const PipelineStateDesc& PSODesc    = m_pPipelineState->GetDesc();

    static_assert(PIPELINE_TYPE_LAST == 4, "Please update the switch below to handle the new pipeline type");
    switch (PSODesc.PipelineType)
    {
        case PIPELINE_TYPE_GRAPHICS:
        case PIPELINE_TYPE_MESH:
        {
            const GraphicsPipelineDesc& GraphicsPipeline = m_pPipelineState->GetGraphicsPipelineDesc();
            m_CommandBuffer.BindGraphicsPipeline(vkPipeline);

            if (CommitStates)
            {
                m_CommandBuffer.SetStencilReference(m_StencilRef);
                m_CommandBuffer.SetBlendConstants(m_BlendFactors);
                CommitViewports();
            }

            if (GraphicsPipeline.RasterizerDesc.ScissorEnable && (CommitStates || CommitScissor))
            {
                CommitScissorRects();
            }
            m_State.vkPipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;

            m_State.NullRenderTargets =
                GraphicsPipeline.pRenderPass == nullptr &&
                GraphicsPipeline.NumRenderTargets == 0 &&
                GraphicsPipeline.DSVFormat == TEX_FORMAT_UNKNOWN;
            break;
        }
        case PIPELINE_TYPE_COMPUTE:
        {
            m_CommandBuffer.BindComputePipeline(vkPipeline);
            m_State.vkPipelineBindPoint = VK_PIPELINE_BIND_POINT_COMPUTE;
            break;
        }
        case PIPELINE_TYPE_RAY_TRACING:
        {
            m_CommandBuffer.BindRayTracingPipeline(vkPipeline);
            m_State.vkPipelineBindPoint = VK_PIPELINE_BIND_POINT_RAY_TRACING_KHR;
            break;
        }
        case PIPELINE_TYPE_TILE:
            UNEXPECTED("Unsupported pipeline type");
            break;
        default:
            UNEXPECTED("unknown pipeline type");
    }

    const PipelineLayoutVk& Layout    = m_pPipelineState->GetPipelineLayout();
    const Uint32            SignCount = m_pPipelineState->GetResourceSignatureCount();
    ResourceBindInfo&       BindInfo  = GetBindInfo(PSODesc.PipelineType);

    Uint32 DvpCompatibleSRBCount = 0;
    PrepareCommittedResources(BindInfo, DvpCompatibleSRBCount);
#ifdef DILIGENT_DEVELOPMENT
    for (Uint32 sign = DvpCompatibleSRBCount; sign < SignCount; ++sign)
    {
        // Do not clear DescriptorSetBaseInd and DynamicOffsetCount!
        BindInfo.SetInfo[sign].vkSets.fill(VK_NULL_HANDLE);
    }
#endif

    BindInfo.vkPipelineLayout = Layout.GetVkPipelineLayout();

    Uint32 TotalDynamicOffsetCount = 0;
    for (Uint32 i = 0; i < SignCount; ++i)
    {
        ResourceBindInfo::DescriptorSetInfo& SetInfo = BindInfo.SetInfo[i];

        PipelineResourceSignatureVkImpl* pSignature = m_pPipelineState->GetResourceSignature(i);
        if (pSignature == nullptr || pSignature->GetNumDescriptorSets() == 0)
        {
            SetInfo = {};
            continue;
        }

        VERIFY_EXPR(BindInfo.ActiveSRBMask & (1u << i));

        SetInfo.BaseInd            = Layout.GetFirstDescrSetIndex(pSignature->GetDesc().BindingIndex);
        SetInfo.DynamicOffsetCount = pSignature->GetDynamicOffsetCount();
        TotalDynamicOffsetCount += SetInfo.DynamicOffsetCount;
    }

    // Reserve space to store all dynamic buffer offsets
    m_DynamicBufferOffsets.resize(TotalDynamicOffsetCount);
}